

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateResizeBilinearLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint uVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  LayerUnion LVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  uint __len;
  string err;
  string __str;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_f8,layer,1,1);
  __return_storage_ptr__->m_type = local_f8._0_4_;
  __return_storage_ptr__->m_reason = local_f8._4_4_;
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &aStack_e0) {
    operator_delete(local_f0._M_p,aStack_e0._M_allocated_capacity + 1);
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    validateOutputCount((Result *)local_f8,layer,1,1);
    __return_storage_ptr__->m_type = local_f8._0_4_;
    __return_storage_ptr__->m_reason = local_f8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &aStack_e0) {
      operator_delete(local_f0._M_p,aStack_e0._M_allocated_capacity + 1);
    }
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ResizeBilinear","");
    validateInputOutputRankEquality((Result *)local_f8,layer,&local_70,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_f8._0_4_;
    __return_storage_ptr__->m_reason = local_f8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &aStack_e0) {
      operator_delete(local_f0._M_p,aStack_e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ResizeBilinear","");
    validateRankCount((Result *)local_f8,layer,&local_d0,3,-1,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_f8._0_4_;
    __return_storage_ptr__->m_reason = local_f8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &aStack_e0) {
      operator_delete(local_f0._M_p,aStack_e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 0xd3) {
    LVar4 = layer->layer_;
  }
  else {
    LVar4.resizebilinear_ = Specification::ResizeBilinearLayerParams::default_instance();
  }
  if ((((LVar4.convolution_)->kernelsize_).current_size_ & 0xfffffffdU) == 0) {
    return __return_storage_ptr__;
  }
  std::operator+(&local_50,"Target Size in the resize bilinear layer \'",(layer->name_).ptr_);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = &local_80;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_80 = *puVar8;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *puVar8;
    local_90 = (ulong *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar1 = ((LVar4.convolution_)->kernelsize_).current_size_;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_002db921;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_002db921;
      }
      if (uVar7 < 10000) goto LAB_002db921;
      uVar10 = uVar10 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_002db921:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_b0),__len,__val);
  uVar10 = 0xf;
  if (local_90 != &local_80) {
    uVar10 = local_80;
  }
  if (uVar10 < (ulong)(local_a8 + local_88)) {
    uVar10 = 0xf;
    if (local_b0 != local_a0) {
      uVar10 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_88) <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_002db9bc;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_002db9bc:
  local_f8 = (undefined1  [8])&local_e8;
  psVar9 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar9) {
    local_e8 = *psVar9;
    aStack_e0._M_allocated_capacity = puVar6[3];
  }
  else {
    local_e8 = *psVar9;
    local_f8 = (undefined1  [8])*puVar6;
  }
  local_f0._M_p = (pointer)puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_f8);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar5[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Result::Result((Result *)local_f8,INVALID_MODEL_PARAMETERS,&local_d0);
  __return_storage_ptr__->m_type = local_f8._0_4_;
  __return_storage_ptr__->m_reason = local_f8._4_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &aStack_e0) {
    operator_delete(local_f0._M_p,aStack_e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateResizeBilinearLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "ResizeBilinear", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "ResizeBilinear", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.resizebilinear();
    // target Size must be 2D if provided
    if (!(params.targetsize_size() == 0 || params.targetsize_size() == 2)) {
        std::string err = "Target Size in the resize bilinear layer '" + layer.name() + "' must be a vector of size 2 (i.e height, width) but is a vector of size " + std::to_string(params.targetsize_size()) + ".";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}